

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_uv.cc
# Opt level: O0

void libyuv::ScaleUVSimple
               (int src_width,int src_height,int dst_width,int dst_height,int src_stride,
               int dst_stride,uint8_t *src_uv,uint8_t *dst_uv,int x,int dx,int y,int dy)

{
  int in_ECX;
  int in_EDX;
  int in_EDI;
  int in_R8D;
  int in_R9D;
  long in_stack_00000008;
  _func_void_uint8_t_ptr_uint8_t_ptr_int_int_int *ScaleUVCols;
  int in_stack_00000018;
  int j;
  code *local_30;
  code *local_28;
  int local_1c;
  
  if (in_EDI < 0x8000) {
    local_30 = ScaleUVCols_C;
  }
  else {
    local_30 = ScaleUVCols64_C;
  }
  local_28 = local_30;
  if ((in_EDI << 1 == in_EDX) && (in_stack_00000018 < 0x8000)) {
    local_28 = ScaleUVColsUp2_C;
  }
  for (local_1c = 0; local_1c < in_ECX; local_1c = local_1c + 1) {
    (*local_28)(ScaleUVCols,in_stack_00000008 + (dst_height >> 0x10) * in_R8D,in_EDX,
                in_stack_00000018,dst_stride);
    ScaleUVCols = ScaleUVCols + in_R9D;
    dst_height = src_height + dst_height;
  }
  return;
}

Assistant:

static void ScaleUVSimple(int src_width,
                          int src_height,
                          int dst_width,
                          int dst_height,
                          int src_stride,
                          int dst_stride,
                          const uint8_t* src_uv,
                          uint8_t* dst_uv,
                          int x,
                          int dx,
                          int y,
                          int dy) {
  int j;
  void (*ScaleUVCols)(uint8_t * dst_uv, const uint8_t* src_uv, int dst_width,
                      int x, int dx) =
      (src_width >= 32768) ? ScaleUVCols64_C : ScaleUVCols_C;
  (void)src_height;
#if defined(HAS_SCALEUVCOLS_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3) && src_width < 32768) {
    ScaleUVCols = ScaleUVCols_SSSE3;
  }
#endif
#if defined(HAS_SCALEUVCOLS_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    ScaleUVCols = ScaleUVCols_Any_NEON;
    if (IS_ALIGNED(dst_width, 8)) {
      ScaleUVCols = ScaleUVCols_NEON;
    }
  }
#endif
#if defined(HAS_SCALEUVCOLS_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    ScaleUVCols = ScaleUVCols_Any_MMI;
    if (IS_ALIGNED(dst_width, 1)) {
      ScaleUVCols = ScaleUVCols_MMI;
    }
  }
#endif
#if defined(HAS_SCALEUVCOLS_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    ScaleUVCols = ScaleUVCols_Any_MSA;
    if (IS_ALIGNED(dst_width, 4)) {
      ScaleUVCols = ScaleUVCols_MSA;
    }
  }
#endif
  if (src_width * 2 == dst_width && x < 0x8000) {
    ScaleUVCols = ScaleUVColsUp2_C;
#if defined(HAS_SCALEUVCOLSUP2_SSSE3)
    if (TestCpuFlag(kCpuHasSSSE3) && IS_ALIGNED(dst_width, 8)) {
      ScaleUVCols = ScaleUVColsUp2_SSSE3;
    }
#endif
#if defined(HAS_SCALEUVCOLSUP2_MMI)
    if (TestCpuFlag(kCpuHasMMI) && IS_ALIGNED(dst_width, 4)) {
      ScaleUVCols = ScaleUVColsUp2_MMI;
    }
#endif
  }

  for (j = 0; j < dst_height; ++j) {
    ScaleUVCols(dst_uv, src_uv + (y >> 16) * src_stride, dst_width, x, dx);
    dst_uv += dst_stride;
    y += dy;
  }
}